

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O2

int run_test_getaddrinfo_basic_sync(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_getaddrinfo_t req;
  uv_getaddrinfo_t local_a0;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_getaddrinfo(puVar2,&local_a0,(uv_getaddrinfo_cb)0x0,"localhost",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar1 == 0) {
    uv_freeaddrinfo(local_a0.addrinfo);
    puVar2 = uv_default_loop();
    close_loop(puVar2);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
    pcVar4 = "0 == uv_loop_close(uv_default_loop())";
    uVar3 = 0x9d;
  }
  else {
    pcVar4 = "0 == uv_getaddrinfo(uv_default_loop(), &req, NULL, name, NULL, NULL)";
    uVar3 = 0x9a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(getaddrinfo_basic_sync) {
  uv_getaddrinfo_t req;

  ASSERT(0 == uv_getaddrinfo(uv_default_loop(),
                             &req,
                             NULL,
                             name,
                             NULL,
                             NULL));
  uv_freeaddrinfo(req.addrinfo);

  MAKE_VALGRIND_HAPPY();
  return 0;
}